

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueue.h
# Opt level: O1

bool __thiscall
rigtorp::SPSCQueue<TestType,_std::allocator<TestType>_>::try_emplace<>
          (SPSCQueue<TestType,_std::allocator<TestType>_> *this)

{
  size_t sVar1;
  __int_type_conflict _Var2;
  bool bVar3;
  size_t sVar4;
  
  _Var2 = (this->writeIdx_).super___atomic_base<unsigned_long>._M_i;
  sVar1 = _Var2 + 1;
  sVar4 = 0;
  if (sVar1 != this->capacity_) {
    sVar4 = sVar1;
  }
  if ((sVar4 == this->readIdxCache_) &&
     (sVar1 = (this->readIdx_).super___atomic_base<unsigned_long>._M_i, this->readIdxCache_ = sVar1,
     sVar4 == sVar1)) {
    bVar3 = false;
  }
  else {
    TestType::TestType(this->slots_ + _Var2 + 0x40);
    (this->writeIdx_).super___atomic_base<unsigned_long>._M_i = sVar4;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

RIGTORP_NODISCARD bool try_emplace(Args &&...args) noexcept(
      std::is_nothrow_constructible<T, Args &&...>::value) {
    static_assert(std::is_constructible<T, Args &&...>::value,
                  "T must be constructible with Args&&...");
    auto const writeIdx = writeIdx_.load(std::memory_order_relaxed);
    auto nextWriteIdx = writeIdx + 1;
    if (nextWriteIdx == capacity_) {
      nextWriteIdx = 0;
    }
    if (nextWriteIdx == readIdxCache_) {
      readIdxCache_ = readIdx_.load(std::memory_order_acquire);
      if (nextWriteIdx == readIdxCache_) {
        return false;
      }
    }
    new (&slots_[writeIdx + kPadding]) T(std::forward<Args>(args)...);
    writeIdx_.store(nextWriteIdx, std::memory_order_release);
    return true;
  }